

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# store.c
# Opt level: O0

void store_delete(store *s,object *obj,wchar_t amt)

{
  object *local_28;
  object *known_obj;
  object *poStack_18;
  wchar_t amt_local;
  object *obj_local;
  store *s_local;
  
  local_28 = obj->known;
  if (amt < (int)(uint)obj->number) {
    obj->number = obj->number - (char)amt;
    local_28->number = local_28->number - (char)amt;
  }
  else {
    known_obj._4_4_ = amt;
    poStack_18 = obj;
    obj_local = (object *)s;
    pile_excise(&s->stock,obj);
    object_delete((chunk *)0x0,(chunk *)0x0,&stack0xffffffffffffffe8);
    pile_excise((object **)&obj_local->weight,local_28);
    object_delete((chunk *)0x0,(chunk *)0x0,&local_28);
    if ((char)obj_local->oidx == '\0') {
      __assert_fail("s->stock_num",
                    "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/store.c"
                    ,0x4c4,"void store_delete(struct store *, struct object *, int)");
    }
    *(char *)&obj_local->oidx = (char)obj_local->oidx + -1;
  }
  return;
}

Assistant:

static void store_delete(struct store *s, struct object *obj, int amt)
{
	struct object *known_obj = obj->known;

	if (obj->number > amt) {
		obj->number -= amt;
		known_obj->number -= amt;
	} else {
		pile_excise(&s->stock, obj);
		object_delete(NULL, NULL, &obj);
		pile_excise(&s->stock_k, known_obj);
		object_delete(NULL, NULL, &known_obj);
		assert(s->stock_num);
		s->stock_num--;
	}
}